

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O0

void erase_in_line(options *param_1)

{
  int iVar1;
  double dVar2;
  uint local_14;
  int col;
  int row;
  options *param_1_local;
  
  for (local_14 = 1; (int)local_14 < 0x19; local_14 = local_14 + 1) {
    if (erase_in_line(options_const&)::pi == '\0') {
      iVar1 = __cxa_guard_acquire(&erase_in_line(options_const&)::pi);
      if (iVar1 != 0) {
        dVar2 = acos(-1.0);
        erase_in_line::pi = (float)dVar2;
        __cxa_guard_release(&erase_in_line(options_const&)::pi);
      }
    }
    dVar2 = sin(((double)(int)local_14 * 2.0 * (double)erase_in_line::pi) / 24.0);
    printf("\x1b[%d;%dH\x1b[1K\x1b[24C\x1b[K",(ulong)local_14,
           (ulong)(uint)(int)(dVar2 * 28.0 + 28.0));
  }
  return;
}

Assistant:

void erase_in_line(const options &)
{
    for (int row = 1; row <= 24; ++row)
    {
        static const float pi = acos(-1.0f);
        int col = static_cast<int>((40-12) + (40-12)*std::sin(row*2.0*pi/24));
        std::printf("\033[%d;%dH\033[1K\033[24C\033[K", row, col);
    }
}